

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# font_to_svg.hpp
# Opt level: O0

void __thiscall font2svg::ttf_file::free(ttf_file *this,void *__ptr)

{
  FT_Error FVar1;
  ostream *poVar2;
  ttf_file *this_local;
  
  std::operator<<((ostream *)(debug_abi_cxx11_ + 0x10),"\n<!--");
  FVar1 = FT_Done_Face(this->face);
  this->error = FVar1;
  poVar2 = std::operator<<((ostream *)(debug_abi_cxx11_ + 0x10),"\nFree face. error code: ");
  std::ostream::operator<<(poVar2,this->error);
  FVar1 = FT_Done_FreeType(this->library);
  this->error = FVar1;
  poVar2 = std::operator<<((ostream *)(debug_abi_cxx11_ + 0x10),"\nFree library. error code: ");
  std::ostream::operator<<(poVar2,this->error);
  std::operator<<((ostream *)(debug_abi_cxx11_ + 0x10),"\n-->\n");
  return;
}

Assistant:

void free()
	{
		debug << "\n<!--";
		error = FT_Done_Face( face );
		debug << "\nFree face. error code: " << error;
		error = FT_Done_FreeType( library );
		debug << "\nFree library. error code: " << error;
		debug << "\n-->\n";
	}